

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpCodeUtilAsmJs.cpp
# Opt level: O0

char16 * Js::OpCodeUtilAsmJs::GetOpCodeName(OpCodeAsmJs op)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  OpCodeAsmJs local_12;
  uint opIndex;
  OpCodeAsmJs op_local;
  
  local_12 = op;
  if (op < InvalidOpCode) {
    bVar2 = operator<(&local_12,0x100);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/OpCodeUtilAsmJs.cpp"
                                  ,0x1d,"(op < (sizeof(*__countof_helper(OpCodeAsmJsNames)) + 0))",
                                  "op < _countof(OpCodeAsmJsNames)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    _opIndex = *(char16_t **)(OpCodeAsmJsNames + (long)(int)(uint)local_12 * 8);
  }
  else if (op < ByteCodeLast) {
    uVar3 = Js::operator+(MaxByteSizedOpcodes,1);
    uVar3 = Js::operator-(op,uVar3);
    if (0x171 < uVar3) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/OpCodeUtilAsmJs.cpp"
                                  ,0x24,
                                  "(opIndex < (sizeof(*__countof_helper(ExtendedOpCodeAsmJsNames)) + 0))"
                                  ,"opIndex < _countof(ExtendedOpCodeAsmJsNames)");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    _opIndex = *(char16_t **)(ExtendedOpCodeAsmJsNames + (ulong)uVar3 * 8);
  }
  else {
    _opIndex = L"<NotAvail>";
  }
  return _opIndex;
}

Assistant:

char16 const * OpCodeUtilAsmJs::GetOpCodeName(OpCodeAsmJs op)
    {
        if (op <= Js::OpCodeAsmJs::MaxByteSizedOpcodes)
        {
            Assert(op < _countof(OpCodeAsmJsNames));
            __analysis_assume(op < _countof(OpCodeAsmJsNames));
            return OpCodeAsmJsNames[(int)op];
        }
        else if (op < Js::OpCodeAsmJs::ByteCodeLast)
        {
            uint opIndex = op - (Js::OpCodeAsmJs::MaxByteSizedOpcodes + 1);
            Assert(opIndex < _countof(ExtendedOpCodeAsmJsNames));
            __analysis_assume(opIndex < _countof(ExtendedOpCodeAsmJsNames));
            return ExtendedOpCodeAsmJsNames[opIndex];
        }
        return _u("<NotAvail>");
    }